

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O3

float sensitivity(baseline *data,base_learner *base,example *ec)

{
  float *pfVar1;
  float *pfVar2;
  single_learner *psVar3;
  vw_exception *this;
  unsigned_long *puVar4;
  float fVar5;
  float fVar6;
  stringstream __msg;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198;
  
  if (data->check_enabled != true) {
LAB_0020f7c4:
    if (data->global_only == false) {
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_198,"sensitivity for baseline without --global_only not implemented",0x3e);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/baseline.cc"
                 ,0xa9,&local_1c8);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    VW::copy_example_metadata(false,data->ec,ec);
    (data->ec->l).simple.label = (ec->l).simple.label;
    (data->ec->pred).scalar = (ec->pred).scalar;
    fVar6 = (float)(**(code **)(base + 0x50))
                             (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),data->ec);
    psVar3 = LEARNER::as_singleline<char,char>(base);
    (**(code **)(psVar3 + 0x30))
              (*(undefined8 *)(psVar3 + 0x18),*(undefined8 *)(psVar3 + 0x20),data->ec);
    (ec->l).simple.initial = (data->ec->pred).scalar;
    fVar5 = (float)(**(code **)(base + 0x50))
                             (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),ec);
    return fVar5 + fVar6;
  }
  pfVar2 = (ec->super_example_predict).feature_space[0x89].values._begin;
  pfVar1 = (ec->super_example_predict).feature_space[0x89].values._end;
  if (pfVar2 != pfVar1) {
    puVar4 = (ec->super_example_predict).feature_space[0x89].indicies._begin;
    do {
      if (*puVar4 == 0x54d) {
        if ((*pfVar2 == 1.0) && (!NAN(*pfVar2))) goto LAB_0020f7c4;
        break;
      }
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 1;
    } while (pfVar2 != pfVar1);
  }
  fVar6 = (float)(**(code **)(base + 0x50))
                           (*(undefined8 *)(base + 0x48),*(undefined8 *)(base + 0x20),ec);
  return fVar6;
}

Assistant:

float sensitivity(baseline& data, base_learner& base, example& ec)
{
  // no baseline if check_enabled is true and example contains flag
  if (data.check_enabled && !BASELINE::baseline_enabled(&ec))
    return base.sensitivity(ec);

  if (!data.global_only)
    THROW("sensitivity for baseline without --global_only not implemented");

  // sensitivity of baseline term
  VW::copy_example_metadata(/*audit=*/false, data.ec, &ec);
  data.ec->l.simple.label = ec.l.simple.label;
  data.ec->pred.scalar = ec.pred.scalar;
  // cout << "before base" << endl;
  const float baseline_sens = base.sensitivity(*data.ec);
  // cout << "base sens: " << baseline_sens << endl;

  // sensitivity of residual
  as_singleline(&base)->predict(*data.ec);
  ec.l.simple.initial = data.ec->pred.scalar;
  const float sens = base.sensitivity(ec);
  // cout << " residual sens: " << sens << endl;
  return baseline_sens + sens;
}